

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::CloseElement(XMLPrinter *this,bool compactMode)

{
  char *pcVar1;
  byte in_SIL;
  XMLPrinter *in_RDI;
  char *name;
  
  in_RDI->_depth = in_RDI->_depth + -1;
  pcVar1 = DynArray<const_char_*,_10>::Pop(&in_RDI->_stack);
  if ((in_RDI->_elementJustOpened & 1U) == 0) {
    if ((in_RDI->_textDepth < 0) && ((in_SIL & 1) == 0)) {
      Print(in_RDI,"\n");
      (*(in_RDI->super_XMLVisitor)._vptr_XMLVisitor[0xc])(in_RDI,(ulong)(uint)in_RDI->_depth);
    }
    Print(in_RDI,"</%s>",pcVar1);
  }
  else {
    Print(in_RDI,"/>");
  }
  if (in_RDI->_textDepth == in_RDI->_depth) {
    in_RDI->_textDepth = -1;
  }
  if ((in_RDI->_depth == 0) && ((in_SIL & 1) == 0)) {
    Print(in_RDI,"\n");
  }
  in_RDI->_elementJustOpened = false;
  return;
}

Assistant:

void XMLPrinter::CloseElement( bool compactMode )
{
    --_depth;
    const char* name = _stack.Pop();

    if ( _elementJustOpened ) {
        Print( "/>" );
    }
    else {
        if ( _textDepth < 0 && !compactMode) {
            Print( "\n" );
            PrintSpace( _depth );
        }
        Print( "</%s>", name );
    }

    if ( _textDepth == _depth ) {
        _textDepth = -1;
    }
    if ( _depth == 0 && !compactMode) {
        Print( "\n" );
    }
    _elementJustOpened = false;
}